

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_24939c::CallExpr::printLeft(CallExpr *this,OutputStream *S)

{
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  CallExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  Node::print(this->Callee,S);
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
  NodeArray::printWithComma(&this->Args,local_18);
  StringView::StringView(&local_38,")");
  OutputStream::operator+=(local_18,local_38);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Callee->print(S);
    S += "(";
    Args.printWithComma(S);
    S += ")";
  }